

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::GenerateSeriesFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  allocator_type local_781;
  LogicalType local_780 [24];
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  _Function_base local_720;
  code *local_708;
  _Function_base local_700;
  code *local_6e8;
  _Function_base local_6e0;
  code *local_6c8;
  _Function_base local_6c0;
  code *local_6a8;
  LogicalType local_6a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_658;
  LogicalType local_640 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_628;
  LogicalType local_610 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5f8;
  LogicalType local_5e0 [24];
  LogicalType local_5c8 [24];
  LogicalType local_5b0 [24];
  LogicalType local_598 [24];
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5f8,__l,&local_781);
  duckdb::LogicalType::LogicalType(local_780,BIGINT);
  duckdb::LogicalType::LIST(local_610);
  local_6c0._M_functor._8_8_ = 0;
  local_6c0._M_functor._M_unused._M_object = ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_6a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_6c0._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_598,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_5f8,local_610,&local_6c0,0,0,0,0,local_598,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_208);
  ScalarFunction::~ScalarFunction(&local_208);
  duckdb::LogicalType::~LogicalType(local_598);
  std::_Function_base::~_Function_base(&local_6c0);
  duckdb::LogicalType::~LogicalType(local_610);
  duckdb::LogicalType::~LogicalType(local_780);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5f8);
  duckdb::LogicalType::~LogicalType(local_768);
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  duckdb::LogicalType::LogicalType(local_750,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_628,__l_00,&local_781);
  duckdb::LogicalType::LogicalType(local_780,BIGINT);
  duckdb::LogicalType::LIST(local_640);
  local_6e0._M_functor._8_8_ = 0;
  local_6e0._M_functor._M_unused._M_object = ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_6c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_6e0._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_628,local_640,&local_6e0,0,0,0,0,local_5b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_330);
  ScalarFunction::~ScalarFunction(&local_330);
  duckdb::LogicalType::~LogicalType(local_5b0);
  std::_Function_base::~_Function_base(&local_6e0);
  duckdb::LogicalType::~LogicalType(local_640);
  duckdb::LogicalType::~LogicalType(local_780);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_628);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  duckdb::LogicalType::LogicalType(local_750,BIGINT);
  duckdb::LogicalType::LogicalType(local_738,BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_658,__l_01,&local_781);
  duckdb::LogicalType::LogicalType(local_780,BIGINT);
  duckdb::LogicalType::LIST(local_670);
  local_700._M_functor._8_8_ = 0;
  local_700._M_functor._M_unused._M_object = ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_6e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_700._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5c8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_458,&local_658,local_670,&local_700,0,0,0,0,local_5c8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_458);
  ScalarFunction::~ScalarFunction(&local_458);
  duckdb::LogicalType::~LogicalType(local_5c8);
  std::_Function_base::~_Function_base(&local_700);
  duckdb::LogicalType::~LogicalType(local_670);
  duckdb::LogicalType::~LogicalType(local_780);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_658);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_768,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_750,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_738,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l_02,&local_781);
  duckdb::LogicalType::LogicalType(local_780,TIMESTAMP);
  duckdb::LogicalType::LIST(local_6a0);
  local_720._M_functor._8_8_ = 0;
  local_720._M_functor._M_unused._M_object = ListRangeFunction<duckdb::TimestampRangeInfo,true>;
  local_708 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_720._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_580,&local_688,local_6a0,&local_720,0,0,0,0,local_5e0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_580);
  ScalarFunction::~ScalarFunction(&local_580);
  duckdb::LogicalType::~LogicalType(local_5e0);
  std::_Function_base::~_Function_base(&local_720);
  duckdb::LogicalType::~LogicalType(local_6a0);
  duckdb::LogicalType::~LogicalType(local_780);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function = *(BaseScalarFunction **)(in_RDI + 0x20); function != pBVar1;
      function = function + 0x128) {
    BaseScalarFunction::SetReturnsError(local_e0,function);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
  }
  return;
}

Assistant:

ScalarFunctionSet GenerateSeriesFun::GetFunctions() {
	ScalarFunctionSet generate_series;
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                           LogicalType::LIST(LogicalType::TIMESTAMP),
	                                           ListRangeFunction<TimestampRangeInfo, true>));
	for (auto &func : generate_series.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return generate_series;
}